

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_open(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uint uVar3;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  undefined4 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  ulong uVar6;
  int in_R8D;
  sockaddr_in *addr_00;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client;
  uv_udp_t client2;
  uv_buf_t uStack_868;
  sockaddr sStack_858;
  undefined2 uStack_848;
  undefined1 uStack_846;
  undefined5 uStack_845;
  undefined8 uStack_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined6 uStack_800;
  undefined2 uStack_7fa;
  undefined6 uStack_7f8;
  undefined8 uStack_7f2;
  undefined1 auStack_7e8 [536];
  uv_loop_t *puStack_5d0;
  code *pcStack_5c8;
  uv_buf_t uStack_5c0;
  sockaddr_in sStack_5b0;
  uv_udp_t uStack_5a0;
  uv_udp_t uStack_4c8;
  uv_loop_t *puStack_3f0;
  sockaddr_in sStack_3e0;
  uv_udp_t uStack_3d0;
  uv_loop_t *puStack_2f8;
  uv_udp_t uStack_2f0;
  uv_loop_t *puStack_218;
  undefined4 uStack_1e4;
  uv_loop_t *puStack_1e0;
  uv_buf_t local_1d8;
  sockaddr_in local_1c8;
  uv_udp_t local_1b8;
  uv_udp_t local_e0;
  
  puStack_1e0 = (uv_loop_t *)0x17866d;
  local_1d8 = uv_buf_init("PING",4);
  puStack_1e0 = (uv_loop_t *)0x17868c;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_1c8);
  if (iVar1 == 0) {
    puStack_1e0 = (uv_loop_t *)0x178699;
    uVar2 = create_udp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_1e0 = (uv_loop_t *)0x1786a0;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x1786ad;
    iVar1 = uv_udp_init(puVar4,&local_1b8);
    if (iVar1 != 0) goto LAB_001787e3;
    puStack_1e0 = (uv_loop_t *)0x1786c1;
    iVar1 = uv_udp_open(&local_1b8,uVar2);
    if (iVar1 != 0) goto LAB_001787e8;
    puStack_1e0 = (uv_loop_t *)0x1786da;
    iVar1 = uv_udp_bind(&local_1b8,(sockaddr *)&local_1c8,0);
    if (iVar1 != 0) goto LAB_001787ed;
    puStack_1e0 = (uv_loop_t *)0x1786fa;
    iVar1 = uv_udp_recv_start(&local_1b8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_001787f2;
    addr_00 = &local_1c8;
    in_RCX = (undefined4 *)0x1;
    puStack_1e0 = (uv_loop_t *)0x178727;
    iVar1 = uv_udp_send(&send_req,&local_1b8,&local_1d8,1,(sockaddr *)addr_00,send_cb);
    in_R8D = (int)addr_00;
    if (iVar1 != 0) goto LAB_001787f7;
    puStack_1e0 = (uv_loop_t *)0x178734;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x178744;
    iVar1 = uv_udp_init(puVar4,&local_e0);
    if (iVar1 != 0) goto LAB_001787fc;
    puStack_1e0 = (uv_loop_t *)0x17875b;
    iVar1 = uv_udp_open(&local_e0,uVar2);
    if (iVar1 != -0x11) goto LAB_00178801;
    puStack_1e0 = (uv_loop_t *)0x178773;
    uv_close((uv_handle_t *)&local_e0,(uv_close_cb)0x0);
    puStack_1e0 = (uv_loop_t *)0x178778;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x178782;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_00178806;
    if (close_cb_called != 1) goto LAB_0017880b;
    if (local_1b8.send_queue_size != 0) goto LAB_00178810;
    puStack_1e0 = (uv_loop_t *)0x1787a4;
    unaff_RBX = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x1787b8;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_1e0 = (uv_loop_t *)0x1787c2;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_1e0 = (uv_loop_t *)0x1787c7;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x1787cf;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_1e0 = (uv_loop_t *)0x1787e3;
    run_test_udp_open_cold_1();
LAB_001787e3:
    puStack_1e0 = (uv_loop_t *)0x1787e8;
    run_test_udp_open_cold_2();
LAB_001787e8:
    puStack_1e0 = (uv_loop_t *)0x1787ed;
    run_test_udp_open_cold_3();
LAB_001787ed:
    puStack_1e0 = (uv_loop_t *)0x1787f2;
    run_test_udp_open_cold_4();
LAB_001787f2:
    puStack_1e0 = (uv_loop_t *)0x1787f7;
    run_test_udp_open_cold_5();
LAB_001787f7:
    puStack_1e0 = (uv_loop_t *)0x1787fc;
    run_test_udp_open_cold_6();
LAB_001787fc:
    puStack_1e0 = (uv_loop_t *)0x178801;
    run_test_udp_open_cold_7();
LAB_00178801:
    puStack_1e0 = (uv_loop_t *)0x178806;
    run_test_udp_open_cold_8();
LAB_00178806:
    puStack_1e0 = (uv_loop_t *)0x17880b;
    run_test_udp_open_cold_9();
LAB_0017880b:
    puStack_1e0 = (uv_loop_t *)0x178810;
    run_test_udp_open_cold_10();
LAB_00178810:
    puStack_1e0 = (uv_loop_t *)0x178815;
    run_test_udp_open_cold_11();
  }
  puStack_1e0 = (uv_loop_t *)create_udp_socket;
  run_test_udp_open_cold_12();
  puVar4 = (uv_loop_t *)0x2;
  uVar6 = 2;
  puStack_1e0 = unaff_RBX;
  uVar2 = socket(2,2,0);
  if ((int)uVar2 < 0) {
    create_udp_socket_cold_1();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    in_RCX = &uStack_1e4;
    uStack_1e4 = 1;
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    uVar6 = 1;
    in_R8D = 4;
    iVar1 = setsockopt(uVar2,1,2,in_RCX,4);
    if (iVar1 == 0) {
      return uVar2;
    }
  }
  create_udp_socket_cold_2();
  if (uVar6 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x5713f0;
  }
  alloc_cb_cold_1();
  if ((long)uVar6 < 0) {
    recv_cb_cold_7();
    puVar5 = puVar4;
LAB_001788db:
    recv_cb_cold_1();
LAB_001788e0:
    recv_cb_cold_5();
LAB_001788e5:
    recv_cb_cold_2();
LAB_001788ea:
    recv_cb_cold_3();
LAB_001788ef:
    recv_cb_cold_4();
    puVar4 = puVar5;
  }
  else {
    if (uVar6 != 0) {
      puVar5 = puVar4;
      if (in_R8D != 0) goto LAB_001788db;
      if (in_RCX == (undefined4 *)0x0) goto LAB_001788e0;
      if (uVar6 != 4) goto LAB_001788e5;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_001788ea;
      iVar1 = uv_udp_recv_stop((uv_udp_t *)puVar4);
      unaff_RBX = puVar4;
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)puVar4,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_001788ef;
    }
    if (in_RCX == (undefined4 *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)uVar6;
  recv_cb_cold_6();
  if (puVar4 == (uv_loop_t *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close(*(uv_handle_t **)&puVar4->backend_fd,close_cb);
    return extraout_EAX_01;
  }
  send_cb_cold_1();
  puStack_2f8 = (uv_loop_t *)0x178932;
  puStack_218 = unaff_RBX;
  uVar2 = create_udp_socket();
  puStack_2f8 = (uv_loop_t *)0x178939;
  uVar3 = create_udp_socket();
  puVar5 = (uv_loop_t *)(ulong)uVar3;
  puStack_2f8 = (uv_loop_t *)0x178940;
  puVar4 = uv_default_loop();
  puStack_2f8 = (uv_loop_t *)0x17894b;
  iVar1 = uv_udp_init(puVar4,&uStack_2f0);
  if (iVar1 == 0) {
    puStack_2f8 = (uv_loop_t *)0x17895d;
    iVar1 = uv_udp_open(&uStack_2f0,uVar2);
    if (iVar1 != 0) goto LAB_001789d9;
    puStack_2f8 = (uv_loop_t *)0x17896b;
    iVar1 = uv_udp_open(&uStack_2f0,uVar3);
    if (iVar1 != -0x10) goto LAB_001789de;
    puStack_2f8 = (uv_loop_t *)0x178977;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_001789e3;
    puStack_2f8 = (uv_loop_t *)0x178985;
    uv_close((uv_handle_t *)&uStack_2f0,(uv_close_cb)0x0);
    puStack_2f8 = (uv_loop_t *)0x17898a;
    puVar4 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x178994;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_2f8 = (uv_loop_t *)0x178999;
    puVar5 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x1789ad;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_2f8 = (uv_loop_t *)0x1789b7;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_2f8 = (uv_loop_t *)0x1789bc;
    puVar4 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x1789c4;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_2f8 = (uv_loop_t *)0x1789d9;
    run_test_udp_open_twice_cold_1();
LAB_001789d9:
    puStack_2f8 = (uv_loop_t *)0x1789de;
    run_test_udp_open_twice_cold_2();
LAB_001789de:
    puStack_2f8 = (uv_loop_t *)0x1789e3;
    run_test_udp_open_twice_cold_3();
LAB_001789e3:
    puStack_2f8 = (uv_loop_t *)0x1789e8;
    run_test_udp_open_twice_cold_4();
  }
  puStack_2f8 = (uv_loop_t *)run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  puStack_3f0 = (uv_loop_t *)0x178a0b;
  puStack_2f8 = puVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3e0);
  if (iVar1 == 0) {
    puStack_3f0 = (uv_loop_t *)0x178a18;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    puStack_3f0 = (uv_loop_t *)0x178a2b;
    iVar1 = bind(uVar3,(sockaddr *)&sStack_3e0,0x10);
    if (iVar1 != 0) goto LAB_00178adc;
    puStack_3f0 = (uv_loop_t *)0x178a38;
    puVar4 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178a45;
    iVar1 = uv_udp_init(puVar4,&uStack_3d0);
    if (iVar1 != 0) goto LAB_00178ae1;
    puStack_3f0 = (uv_loop_t *)0x178a59;
    iVar1 = uv_udp_open(&uStack_3d0,uVar3);
    if (iVar1 != 0) goto LAB_00178ae6;
    puStack_3f0 = (uv_loop_t *)0x178a79;
    iVar1 = uv_udp_recv_start(&uStack_3d0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178aeb;
    puStack_3f0 = (uv_loop_t *)0x178a89;
    uv_close((uv_handle_t *)&uStack_3d0,(uv_close_cb)0x0);
    puStack_3f0 = (uv_loop_t *)0x178a8e;
    puVar4 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178a98;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_3f0 = (uv_loop_t *)0x178a9d;
    puVar5 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178ab1;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_3f0 = (uv_loop_t *)0x178abb;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_3f0 = (uv_loop_t *)0x178ac0;
    puVar4 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178ac8;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_3f0 = (uv_loop_t *)0x178adc;
    run_test_udp_open_bound_cold_1();
LAB_00178adc:
    puStack_3f0 = (uv_loop_t *)0x178ae1;
    run_test_udp_open_bound_cold_2();
LAB_00178ae1:
    puStack_3f0 = (uv_loop_t *)0x178ae6;
    run_test_udp_open_bound_cold_3();
LAB_00178ae6:
    puStack_3f0 = (uv_loop_t *)0x178aeb;
    run_test_udp_open_bound_cold_4();
LAB_00178aeb:
    puStack_3f0 = (uv_loop_t *)0x178af0;
    run_test_udp_open_bound_cold_5();
  }
  puStack_3f0 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_5c8 = (code *)0x178b0e;
  puStack_3f0 = puVar5;
  uStack_5c0 = uv_buf_init("PING",4);
  pcStack_5c8 = (code *)0x178b2d;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5b0);
  if (iVar1 == 0) {
    pcStack_5c8 = (code *)0x178b3a;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    pcStack_5c8 = (code *)0x178b41;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178b4e;
    iVar1 = uv_udp_init(puVar4,&uStack_5a0);
    if (iVar1 != 0) goto LAB_00178c7a;
    pcStack_5c8 = (code *)0x178b67;
    iVar1 = connect(uVar3,(sockaddr *)&sStack_5b0,0x10);
    if (iVar1 != 0) goto LAB_00178c7f;
    pcStack_5c8 = (code *)0x178b7b;
    iVar1 = uv_udp_open(&uStack_5a0,uVar3);
    if (iVar1 != 0) goto LAB_00178c84;
    pcStack_5c8 = (code *)0x178b88;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178b98;
    iVar1 = uv_udp_init(puVar4,&uStack_4c8);
    if (iVar1 != 0) goto LAB_00178c89;
    pcStack_5c8 = (code *)0x178bb4;
    iVar1 = uv_udp_bind(&uStack_4c8,(sockaddr *)&sStack_5b0,0);
    if (iVar1 != 0) goto LAB_00178c8e;
    pcStack_5c8 = (code *)0x178bd7;
    iVar1 = uv_udp_recv_start(&uStack_4c8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178c93;
    pcStack_5c8 = (code *)0x178c02;
    iVar1 = uv_udp_send(&send_req,&uStack_5a0,&uStack_5c0,1,(sockaddr *)0x0,send_cb);
    if (iVar1 != 0) goto LAB_00178c98;
    pcStack_5c8 = (code *)0x178c0f;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178c19;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_00178c9d;
    if (close_cb_called != 2) goto LAB_00178ca2;
    if ((void *)uStack_5a0.send_queue_size != (void *)0x0) goto LAB_00178ca7;
    pcStack_5c8 = (code *)0x178c3b;
    puVar5 = uv_default_loop();
    pcStack_5c8 = (code *)0x178c4f;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStack_5c8 = (code *)0x178c59;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_5c8 = (code *)0x178c5e;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178c66;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_5c8 = (code *)0x178c7a;
    run_test_udp_open_connect_cold_1();
LAB_00178c7a:
    pcStack_5c8 = (code *)0x178c7f;
    run_test_udp_open_connect_cold_2();
LAB_00178c7f:
    pcStack_5c8 = (code *)0x178c84;
    run_test_udp_open_connect_cold_3();
LAB_00178c84:
    pcStack_5c8 = (code *)0x178c89;
    run_test_udp_open_connect_cold_4();
LAB_00178c89:
    pcStack_5c8 = (code *)0x178c8e;
    run_test_udp_open_connect_cold_5();
LAB_00178c8e:
    pcStack_5c8 = (code *)0x178c93;
    run_test_udp_open_connect_cold_6();
LAB_00178c93:
    pcStack_5c8 = (code *)0x178c98;
    run_test_udp_open_connect_cold_7();
LAB_00178c98:
    pcStack_5c8 = (code *)0x178c9d;
    run_test_udp_open_connect_cold_8();
LAB_00178c9d:
    pcStack_5c8 = (code *)0x178ca2;
    run_test_udp_open_connect_cold_9();
LAB_00178ca2:
    pcStack_5c8 = (code *)0x178ca7;
    run_test_udp_open_connect_cold_10();
LAB_00178ca7:
    pcStack_5c8 = (code *)0x178cac;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_5c8 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  puStack_5d0 = puVar5;
  pcStack_5c8 = (code *)(ulong)uVar2;
  uStack_868 = uv_buf_init("PING",4);
  puVar5 = uv_default_loop();
  uStack_845 = 0;
  uStack_840 = 0;
  uStack_838 = 0;
  uStack_830 = 0;
  uStack_828 = 0;
  uStack_820 = 0;
  uStack_818 = 0;
  uStack_810 = 0;
  uStack_808 = 0;
  uStack_800 = 0;
  uStack_7fa = 0;
  uStack_7f8 = 0;
  uStack_7f2 = 0;
  sStack_858.sa_family = 1;
  builtin_strncpy(sStack_858.sa_data,"/tmp/uv-test-s",0xe);
  uStack_848 = 0x636f;
  uStack_846 = 0x6b;
  puVar4 = (uv_loop_t *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_00178e45:
    run_test_udp_send_unix_cold_2();
LAB_00178e4a:
    run_test_udp_send_unix_cold_3();
LAB_00178e4f:
    run_test_udp_send_unix_cold_4();
LAB_00178e54:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = bind(uVar2,&sStack_858,0x6e);
    if (iVar1 != 0) goto LAB_00178e45;
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00178e4a;
    puVar4 = puVar5;
    iVar1 = uv_udp_init(puVar5,(uv_udp_t *)auStack_7e8);
    if (iVar1 != 0) goto LAB_00178e4f;
    puVar4 = (uv_loop_t *)auStack_7e8;
    iVar1 = uv_udp_open((uv_udp_t *)puVar4,uVar2);
    if (iVar1 != 0) goto LAB_00178e54;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar4 = (uv_loop_t *)(auStack_7e8 + 0xd8);
    iVar1 = uv_udp_send((uv_udp_send_t *)puVar4,(uv_udp_t *)auStack_7e8,&uStack_868,1,
                        (sockaddr *)&sStack_858,(uv_udp_send_cb)0x0);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)auStack_7e8,(uv_close_cb)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00178e5e;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00178e5e:
  run_test_udp_send_unix_cold_7();
  if (puVar4 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

#ifndef _WIN32
  {
    uv_udp_t client2;

    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT(r == 0);

    r = uv_udp_open(&client2, sock);
    ASSERT(r == UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#endif  /* !_WIN32 */

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}